

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

int Sim_UtilCountPairsOne(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  long lVar1;
  int i;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (vSupport->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 1;
    iVar3 = 0;
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      if (lVar1 < vSupport->nSize) {
        i = vSupport->pArray[lVar5];
        lVar5 = lVar4;
        do {
          iVar2 = Extra_BitMatrixLookup1(pMat,i,vSupport->pArray[lVar5]);
          iVar3 = iVar3 + iVar2;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < vSupport->nSize);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar1;
    } while (lVar1 < vSupport->nSize);
  }
  return iVar3;
}

Assistant:

int Sim_UtilCountPairsOne( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    int Counter = 0;
//    int Counter2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        Counter += Extra_BitMatrixLookup1( pMat, i, k );
//    Counter2 = Extra_BitMatrixCountOnesUpper(pMat);
//    assert( Counter == Counter2 );
    return Counter;
}